

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderHasValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlNodePtr local_20;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = 0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      local_20 = reader->node;
    }
    else {
      local_20 = reader->curnode;
    }
    xVar1 = local_20->type;
    if (((xVar1 - XML_ATTRIBUTE_NODE < 3) || (xVar1 - XML_PI_NODE < 2)) ||
       (xVar1 == XML_NAMESPACE_DECL)) {
      reader_local._4_4_ = 1;
    }
    else {
      reader_local._4_4_ = 0;
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderHasValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NAMESPACE_DECL:
	    return(1);
	default:
	    break;
    }
    return(0);
}